

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O0

int parse_entry(za_file *zf,zip_entry_type type,char *name,coda_product_class *current_product_class
               ,coda_product_definition *current_product_definition)

{
  int iVar1;
  XML_Status XVar2;
  XML_Error code;
  za_entry *entry_00;
  char *pcVar3;
  size_t sVar4;
  undefined4 *puVar5;
  int *piVar6;
  XML_LChar *pXVar7;
  XML_Size XVar8;
  XML_Index XVar9;
  int local_b0;
  int i;
  int result;
  long filesize;
  za_entry *entry;
  char *entry_name;
  parser_info info;
  coda_product_definition *current_product_definition_local;
  coda_product_class *current_product_class_local;
  char *name_local;
  zip_entry_type type_local;
  za_file *zf_local;
  
  entry = (za_entry *)0x0;
  info._80_8_ = current_product_definition;
  if (type == ze_index) {
    entry = (za_entry *)strdup("index.xml");
    if (entry == (za_entry *)0x0) {
      coda_set_error(-1,"out of memory (could not duplicate string) (%s:%u)",
                     "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition-parse.c"
                     ,0x1006);
    }
  }
  else if (type == ze_type) {
    if (name == (char *)0x0) {
      __assert_fail("name != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition-parse.c"
                    ,0x100a,
                    "int parse_entry(za_file *, zip_entry_type, const char *, coda_product_class *, coda_product_definition *)"
                   );
    }
    sVar4 = strlen(name);
    entry = (za_entry *)malloc(sVar4 + 0xb);
    if (entry == (za_entry *)0x0) {
      sVar4 = strlen(name);
      coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",sVar4 + 0xb,
                     "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition-parse.c"
                     ,0x100f);
    }
    sprintf((char *)entry,"types/%s.xml",name);
  }
  else if (type == ze_product) {
    if (name == (char *)0x0) {
      __assert_fail("name != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition-parse.c"
                    ,0x1014,
                    "int parse_entry(za_file *, zip_entry_type, const char *, coda_product_class *, coda_product_definition *)"
                   );
    }
    sVar4 = strlen(name);
    entry = (za_entry *)malloc(sVar4 + 0xe);
    if (entry == (za_entry *)0x0) {
      sVar4 = strlen(name);
      coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",sVar4 + 0xe,
                     "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition-parse.c"
                     ,0x1019);
    }
    sprintf((char *)entry,"products/%s.xml",name);
  }
  entry_00 = coda_za_get_entry_by_name(zf,(char *)entry);
  if (entry_00 == (za_entry *)0x0) {
    if (type == ze_index) {
      pcVar3 = coda_za_get_filename(zf);
      coda_set_error(-400,"invalid definition file \'%s\' (index missing)",pcVar3);
    }
    else if (type == ze_type) {
      pcVar3 = coda_za_get_filename(zf);
      coda_set_error(-400,"invalid definition file \'%s\' (definition for type \'%s\' missing)",
                     pcVar3,name);
    }
    else if (type == ze_product) {
      pcVar3 = coda_za_get_filename(zf);
      coda_set_error(-400,"invalid definition file \'%s\' (definition for product \'%s\' missing)",
                     pcVar3,name);
    }
    free(entry);
    zf_local._4_4_ = -1;
  }
  else {
    free(entry);
    parser_info_init((parser_info *)&entry_name);
    info.product_class = (coda_product_class *)info._80_8_;
    info.buffer = (char *)zf;
    info.zf = (za_file *)name;
    info.entry_base_name = (char *)current_product_class;
    sVar4 = coda_za_get_entry_size(entry_00);
    info.hash_data = (hashtable *)malloc(sVar4);
    if (info.hash_data == (hashtable *)0x0) {
      coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",sVar4,
                     "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition-parse.c"
                     ,0x1041);
      parser_info_delete((parser_info *)&entry_name);
      zf_local._4_4_ = -1;
    }
    else {
      iVar1 = coda_za_read_entry(entry_00,(char *)info.hash_data);
      if (iVar1 == 0) {
        info.parser = (XML_Parser)coda_hashtable_new(1);
        if (info.parser == (XML_Parser)0x0) {
          coda_set_error(-1,"out of memory (could not allocate hashtable) (%s:%u)",
                         "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition-parse.c"
                         ,0x104f);
          parser_info_delete((parser_info *)&entry_name);
          zf_local._4_4_ = -1;
        }
        else {
          for (local_b0 = 0; local_b0 < 0x2b; local_b0 = local_b0 + 1) {
            iVar1 = coda_hashtable_add_name
                              ((hashtable *)info.parser,xml_full_element_name[local_b0]);
            if (iVar1 != 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition-parse.c"
                            ,0x1057,
                            "int parse_entry(za_file *, zip_entry_type, const char *, coda_product_class *, coda_product_definition *)"
                           );
            }
          }
          info.node = (node_info *)coda_XML_ParserCreateNS((XML_Char *)0x0,' ');
          if ((XML_Parser)info.node == (XML_Parser)0x0) {
            coda_set_error(-0xe,"could not create XML parser");
            parser_info_delete((parser_info *)&entry_name);
            zf_local._4_4_ = -1;
          }
          else {
            coda_XML_SetUserData((XML_Parser)info.node,(parser_info *)&entry_name);
            coda_XML_SetElementHandler
                      ((XML_Parser)info.node,start_element_handler,end_element_handler);
            push_node((parser_info *)&entry_name,no_element,(char **)0x0);
            entry_name[0x44] = '\0';
            entry_name[0x45] = '\0';
            entry_name[0x46] = '\0';
            entry_name[0x47] = '\0';
            if (type == ze_index) {
              register_sub_element
                        ((node_info *)entry_name,element_cd_product_class,cd_product_class_init,
                         data_dictionary_add_product_class);
            }
            else if (type == ze_type) {
              register_type_elements((node_info *)entry_name,product_class_add_named_type);
            }
            else if (type == ze_product) {
              register_sub_element
                        ((node_info *)entry_name,element_cd_product_definition,
                         cd_product_definition_sub_init,(add_element_to_parent_handler)0x0);
            }
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_00246fb8);
            *puVar5 = 0;
            XVar2 = coda_XML_Parse((XML_Parser)info.node,(char *)info.hash_data,(int)sVar4,1);
            if (((XVar2 == XML_STATUS_ERROR) ||
                (piVar6 = (int *)__tls_get_addr(&PTR_00246fb8), *piVar6 != 0)) &&
               (info.product_class_revision == 0)) {
              piVar6 = (int *)__tls_get_addr(&PTR_00246fb8);
              if (*piVar6 == 0) {
                code = coda_XML_GetErrorCode((XML_Parser)info.node);
                pXVar7 = coda_XML_ErrorString(code);
                coda_set_error(-400,"xml parse error: %s",pXVar7);
              }
              piVar6 = (int *)__tls_get_addr(&PTR_00246fb8);
              if (((*piVar6 == -400) ||
                  (piVar6 = (int *)__tls_get_addr(&PTR_00246fb8), *piVar6 == -0x191)) &&
                 (info.abort_parser != 0)) {
                pcVar3 = coda_za_get_filename(zf);
                coda_add_error_message(" (in %s@",pcVar3);
                if (type == ze_index) {
                  coda_add_error_message("index",0);
                }
                else if (type == ze_type) {
                  coda_add_error_message("types/%s",name);
                }
                else if (type == ze_product) {
                  coda_add_error_message("products/%s",name);
                }
                XVar8 = coda_XML_GetCurrentLineNumber((XML_Parser)info.node);
                XVar9 = coda_XML_GetCurrentByteIndex((XML_Parser)info.node);
                coda_add_error_message(", line %lu, byte offset %ld)",XVar8,XVar9);
              }
              parser_info_delete((parser_info *)&entry_name);
              zf_local._4_4_ = -1;
            }
            else {
              parser_info_delete((parser_info *)&entry_name);
              zf_local._4_4_ = 0;
            }
          }
        }
      }
      else {
        parser_info_delete((parser_info *)&entry_name);
        zf_local._4_4_ = -1;
      }
    }
  }
  return zf_local._4_4_;
}

Assistant:

static int parse_entry(za_file *zf, zip_entry_type type, const char *name, coda_product_class *current_product_class,
                       coda_product_definition *current_product_definition)
{
    parser_info info;
    char *entry_name = NULL;
    za_entry *entry;
    long filesize;
    int result;
    int i;

    switch (type)
    {
        case ze_index:
            entry_name = strdup("index.xml");
            if (entry_name == NULL)
            {
                coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not duplicate string) (%s:%u)", __FILE__,
                               __LINE__);
            }
            break;
        case ze_type:
            assert(name != NULL);
            entry_name = malloc(6 + strlen(name) + 4 + 1);
            if (entry_name == NULL)
            {
                coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                               (long)6 + strlen(name) + 4 + 1, __FILE__, __LINE__);
            }
            sprintf(entry_name, "types/%s.xml", name);
            break;
        case ze_product:
            assert(name != NULL);
            entry_name = malloc(9 + strlen(name) + 4 + 1);
            if (entry_name == NULL)
            {
                coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                               (long)9 + strlen(name) + 4 + 1, __FILE__, __LINE__);
            }
            sprintf(entry_name, "products/%s.xml", name);
            break;
    }

    entry = za_get_entry_by_name(zf, entry_name);
    if (entry == NULL)
    {
        switch (type)
        {
            case ze_index:
                coda_set_error(CODA_ERROR_DATA_DEFINITION, "invalid definition file '%s' (index missing)",
                               za_get_filename(zf));
                break;
            case ze_type:
                coda_set_error(CODA_ERROR_DATA_DEFINITION, "invalid definition file '%s' "
                               "(definition for type '%s' missing)", za_get_filename(zf), name);
                break;
            case ze_product:
                coda_set_error(CODA_ERROR_DATA_DEFINITION, "invalid definition file '%s' "
                               "(definition for product '%s' missing)", za_get_filename(zf), name);
                break;
        }
        free(entry_name);
        return -1;
    }
    free(entry_name);

    parser_info_init(&info);
    info.zf = zf;
    info.entry_base_name = name;
    info.product_class = current_product_class;
    info.product_definition = current_product_definition;

    filesize = za_get_entry_size(entry);
    info.buffer = malloc(filesize);
    if (info.buffer == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                       (long)filesize, __FILE__, __LINE__);
        parser_info_delete(&info);
        return -1;
    }
    if (za_read_entry(entry, info.buffer) != 0)
    {
        parser_info_delete(&info);
        return -1;
    }

    info.hash_data = hashtable_new(1);
    if (info.hash_data == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate hashtable) (%s:%u)", __FILE__,
                       __LINE__);
        parser_info_delete(&info);
        return -1;
    }
    for (i = 0; i < num_xml_elements; i++)
    {
        if (hashtable_add_name(info.hash_data, xml_full_element_name[i]) != 0)
        {
            assert(0);
        }
    }

    info.parser = XML_ParserCreateNS(NULL, ' ');
    if (info.parser == NULL)
    {
        coda_set_error(CODA_ERROR_XML, "could not create XML parser");
        parser_info_delete(&info);
        return -1;
    }
    XML_SetUserData(info.parser, &info);
    XML_SetElementHandler(info.parser, start_element_handler, end_element_handler);
    push_node(&info, no_element, NULL);
    info.node->format_set = 0;
    switch (type)
    {
        case ze_index:
            register_sub_element(info.node, element_cd_product_class, cd_product_class_init,
                                 data_dictionary_add_product_class);
            break;
        case ze_type:
            register_type_elements(info.node, product_class_add_named_type);
            break;
        case ze_product:
            register_sub_element(info.node, element_cd_product_definition, cd_product_definition_sub_init, NULL);
            break;
    }

    coda_errno = 0;
    result = XML_Parse(info.parser, info.buffer, filesize, 1);
    if ((result == XML_STATUS_ERROR || coda_errno != 0) && !info.ignore_file)
    {
        if (coda_errno == 0)
        {
            coda_set_error(CODA_ERROR_DATA_DEFINITION, "xml parse error: %s",
                           XML_ErrorString(XML_GetErrorCode(info.parser)));
        }
        if ((coda_errno == CODA_ERROR_DATA_DEFINITION || coda_errno == CODA_ERROR_EXPRESSION) &&
            info.add_error_location)
        {
            coda_add_error_message(" (in %s@", za_get_filename(zf));
            switch (type)
            {
                case ze_index:
                    coda_add_error_message("index", NULL);
                    break;
                case ze_type:
                    coda_add_error_message("types/%s", name);
                    break;
                case ze_product:
                    coda_add_error_message("products/%s", name);
                    break;
            }
            coda_add_error_message(", line %lu, byte offset %ld)", (long)XML_GetCurrentLineNumber(info.parser),
                                   (long)XML_GetCurrentByteIndex(info.parser));
        }
        parser_info_delete(&info);
        return -1;
    }
    parser_info_delete(&info);

    return 0;
}